

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbuildmultiphysicsmesh.cpp
# Opt level: O0

void TPZBuildMultiphysicsMesh::AddElements(TPZVec<TPZCompMesh_*> *cmeshVec,TPZCompMesh *MFMesh)

{
  bool bVar1;
  int64_t iVar2;
  int64_t iVar3;
  TPZCompEl **ppTVar4;
  TPZGeoEl *pTVar5;
  TPZCompEl *pTVar6;
  TPZChunkVector<TPZCompEl_*,_10> *this;
  TPZCompMesh *in_RSI;
  TPZVec<TPZCompMesh_*> *in_RDI;
  TPZMultiphysicsElement *mfcel_1;
  TPZCompEl *cel_1;
  int64_t el;
  TPZGeoEl *gelF;
  TPZGeoElSide gelside;
  TPZStack<TPZCompElSide,_10> celstack;
  TPZGeoEl *gel;
  int64_t found;
  TPZMultiphysicsInterfaceElement *mfint;
  TPZMultiphysicsElement *mfcel;
  TPZCompEl *cel;
  int64_t iel;
  int64_t imesh;
  int64_t nmesh;
  int64_t nMFEl;
  TPZGeoMesh *gmesh;
  size_t in_stack_00000238;
  char *in_stack_00000240;
  long *in_stack_fffffffffffffe18;
  TPZCompMesh *in_stack_fffffffffffffe20;
  TPZGeoEl *in_stack_fffffffffffffe28;
  TPZCompMesh *in_stack_fffffffffffffe30;
  TPZCompEl *in_stack_fffffffffffffe38;
  TPZChunkVector<TPZCompEl_*,_10> *in_stack_fffffffffffffe40;
  long local_188;
  TPZGeoEl *local_178;
  long local_158;
  long local_38;
  long local_30;
  
  TPZCompMesh::Reference(in_RSI);
  TPZGeoMesh::ResetReference((TPZGeoMesh *)in_stack_fffffffffffffe30);
  iVar2 = TPZCompMesh::NElements((TPZCompMesh *)0x1e3d0d6);
  iVar3 = TPZVec<TPZCompMesh_*>::size(in_RDI);
  local_30 = 0;
  do {
    if (iVar3 <= local_30) {
      for (local_158 = 0; local_158 < iVar2; local_158 = local_158 + 1) {
        in_stack_fffffffffffffe20 =
             (TPZCompMesh *)
             TPZCompMesh::Element(in_stack_fffffffffffffe20,(int64_t)in_stack_fffffffffffffe18);
        if (in_stack_fffffffffffffe20 == (TPZCompMesh *)0x0) {
          in_stack_fffffffffffffe18 = (long *)0x0;
        }
        else {
          in_stack_fffffffffffffe18 =
               (long *)__dynamic_cast(in_stack_fffffffffffffe20,&TPZCompEl::typeinfo,
                                      &TPZMultiphysicsElement::typeinfo,0);
        }
        if (in_stack_fffffffffffffe18 != (long *)0x0) {
          (**(code **)(*in_stack_fffffffffffffe18 + 0x220))();
        }
      }
      return;
    }
    TPZVec<TPZCompMesh_*>::operator[](in_RDI,local_30);
    TPZCompMesh::LoadReferences(in_stack_fffffffffffffe30);
    for (local_38 = 0; local_38 < iVar2; local_38 = local_38 + 1) {
      TPZCompMesh::ElementVec(in_RSI);
      ppTVar4 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (in_stack_fffffffffffffe40,(int64_t)in_stack_fffffffffffffe38);
      pTVar6 = *ppTVar4;
      if (pTVar6 == (TPZCompEl *)0x0) {
        local_178 = (TPZGeoEl *)0x0;
        local_188 = 0;
      }
      else {
        local_178 = (TPZGeoEl *)
                    __dynamic_cast(pTVar6,&TPZCompEl::typeinfo,&TPZMultiphysicsElement::typeinfo,0);
        local_188 = __dynamic_cast(pTVar6,&TPZCompEl::typeinfo,
                                   &TPZMultiphysicsInterfaceElement::typeinfo,0);
      }
      if (local_178 == (TPZGeoEl *)0x0) {
        if (local_188 == 0) {
          pzinternal::DebugStopImpl(in_stack_00000240,in_stack_00000238);
        }
      }
      else {
        bVar1 = false;
        pTVar5 = TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffffe28);
        TPZStack<TPZCompElSide,_10>::TPZStack
                  ((TPZStack<TPZCompElSide,_10> *)in_stack_fffffffffffffe30);
        (**(code **)(*(long *)pTVar5 + 0xf0))();
        TPZGeoElSide::TPZGeoElSide
                  ((TPZGeoElSide *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                   (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
        pTVar6 = TPZGeoEl::Reference(pTVar5);
        if (pTVar6 == (TPZCompEl *)0x0) {
          do {
            pTVar5 = TPZGeoEl::Father((TPZGeoEl *)in_stack_fffffffffffffe20);
            if (pTVar5 == (TPZGeoEl *)0x0) goto LAB_01e3d404;
            this = (TPZChunkVector<TPZCompEl_*,_10> *)
                   TPZGeoEl::Father((TPZGeoEl *)in_stack_fffffffffffffe20);
            in_stack_fffffffffffffe40 = this;
            in_stack_fffffffffffffe38 = TPZGeoEl::Reference((TPZGeoEl *)this);
          } while (in_stack_fffffffffffffe38 == (TPZCompEl *)0x0);
          in_stack_fffffffffffffe28 = local_178;
          in_stack_fffffffffffffe30 = (TPZCompMesh *)TPZGeoEl::Reference((TPZGeoEl *)this);
          (**(code **)(*(long *)in_stack_fffffffffffffe28 + 0x248))
                    (in_stack_fffffffffffffe28,in_stack_fffffffffffffe30,local_30);
          bVar1 = true;
LAB_01e3d404:
          if (!bVar1) {
            (**(code **)(*(long *)local_178 + 0x248))(local_178,0,local_30);
          }
        }
        else {
          pTVar6 = TPZGeoEl::Reference(pTVar5);
          (**(code **)(*(long *)local_178 + 0x248))(local_178,pTVar6,local_30);
        }
        TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1e3d44d);
        TPZStack<TPZCompElSide,_10>::~TPZStack((TPZStack<TPZCompElSide,_10> *)0x1e3d45a);
      }
    }
    TPZGeoMesh::ResetReference((TPZGeoMesh *)in_stack_fffffffffffffe30);
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

void TPZBuildMultiphysicsMesh::AddElements(TPZVec<TPZCompMesh *> &cmeshVec, TPZCompMesh *MFMesh)
{
	TPZGeoMesh *gmesh = MFMesh->Reference();
	gmesh->ResetReference();
	int64_t nMFEl = MFMesh->NElements();
	int64_t nmesh = cmeshVec.size();
	int64_t imesh;
	for(imesh = 0; imesh<nmesh; imesh++)
	{
		cmeshVec[imesh]->LoadReferences();
		int64_t iel;
		for(iel=0; iel<nMFEl; iel++)
		{
            TPZCompEl * cel = MFMesh->ElementVec()[iel];
			TPZMultiphysicsElement * mfcel = dynamic_cast<TPZMultiphysicsElement *> (cel);
            TPZMultiphysicsInterfaceElement * mfint = dynamic_cast<TPZMultiphysicsInterfaceElement *>(cel);
			if(mfcel)
			{
                int64_t found = 0;
                TPZGeoEl * gel = mfcel->Reference();
                TPZStack<TPZCompElSide> celstack;
                TPZGeoElSide gelside(gel,gel->NSides()-1);
                // if the geometric element has a reference, it is an obvious candidate
                if (gel->Reference()) {
                    mfcel->AddElement(gel->Reference(), imesh);
                    continue;
                }
                else
                {
                    TPZGeoEl *gelF = gel;
                    while(gelF->Father())
                    {
                        gelF = gelF->Father();
                        if (gelF->Reference()) {
#ifdef PZDEBUG
                            if (gelF->MaterialId() != gel->MaterialId()) {
                                DebugStop();
                            }
#endif
                            mfcel->AddElement(gelF->Reference(), imesh);
                            found = true;
                            break;
                        }
                    }
                }
                if (!found) {
                    mfcel->AddElement(0, imesh);
                }
            }
            else if (mfint) {
                //set up interface
            }
            else {
                DebugStop();
            }
		}
		gmesh->ResetReference();
	}
    for (int64_t el = 0; el < nMFEl; el++) {
        TPZCompEl *cel = MFMesh->Element(el);
        TPZMultiphysicsElement *mfcel = dynamic_cast<TPZMultiphysicsElement *>(cel);
        if (!mfcel) {
            continue;
        }
        mfcel->InitializeIntegrationRule();
    }
}